

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPPVIndexValuePair.cpp
# Opt level: O0

string * __thiscall JPPVIndexValuePair::SoftPrint_abi_cxx11_(JPPVIndexValuePair *this)

{
  ostream *poVar1;
  long *in_RSI;
  string *in_RDI;
  double dVar2;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"JPPVIndexValuePair: value=");
  dVar2 = (double)(**(code **)(*in_RSI + 0x18))();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  std::operator<<(poVar1,", jpolIndex:");
  std::ostream::operator<<(local_188,in_RSI[3]);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string JPPVIndexValuePair::SoftPrint() const
{
    stringstream ss;
    ss << "JPPVIndexValuePair: value="<< GetValue() <<", jpolIndex:"; 
    ss << _m_jpolIndex;
    return(ss.str());
}